

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode
duckdb_brotli::ReadHuffmanCode
          (uint64_t alphabet_size_max,uint64_t alphabet_size_limit,HuffmanCode *table,
          uint64_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  bool bVar1;
  BrotliDecoderErrorCode BVar2;
  uint32_t uVar3;
  uint8_t *code_lengths;
  ulong *in_RCX;
  BrotliDecoderStateInternal *in_RDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  BrotliDecoderStateInternal *in_R8;
  BrotliDecoderErrorCode result_2;
  uint64_t table_size_1;
  BrotliDecoderErrorCode result_1;
  uint64_t i;
  uint64_t bits;
  uint64_t table_size;
  BrotliDecoderErrorCode result;
  BrotliMetablockHeaderArena *h;
  BrotliBitReader *br;
  uint16_t *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  ulong local_228;
  ulong local_220;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  anon_union_4896_2_000bc10c_for_arena *symbol_lists;
  BrotliBitReader *pBVar4;
  int root_bits;
  BrotliDecoderErrorCode local_1cc;
  
  pBVar4 = &in_R8->br;
  symbol_lists = &in_R8->arena;
  do {
    code_lengths = (uint8_t *)(ulong)(symbol_lists->header).substate_huffman;
    switch(code_lengths) {
    case (uint8_t *)0x0:
      while (pBVar4->bit_pos_ < 2) {
        if (pBVar4->next_in == pBVar4->last_in) {
          bVar1 = false;
          goto LAB_00830fc3;
        }
        in_stack_fffffffffffffdb0 = (uint16_t *)pBVar4->val_;
        pBVar4->val_ = (ulong)in_stack_fffffffffffffdb0 |
                       (ulong)*pBVar4->next_in << ((byte)pBVar4->bit_pos_ & 0x3f);
        pBVar4->bit_pos_ = pBVar4->bit_pos_ + 8;
        pBVar4->next_in = pBVar4->next_in + 1;
      }
      (symbol_lists->header).sub_loop_counter = pBVar4->val_ & 3;
      pBVar4->bit_pos_ = pBVar4->bit_pos_ - 2;
      pBVar4->val_ = pBVar4->val_ >> 2;
      bVar1 = true;
LAB_00830fc3:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((symbol_lists->header).sub_loop_counter == 1) goto switchD_00830d6d_caseD_1;
      (symbol_lists->header).space = 0x20;
      (symbol_lists->header).repeat = 0;
      memset((uint16_t *)((long)symbol_lists + 0x6fa),0,0xc);
      memset((uint16_t *)((long)symbol_lists + 0x6e8),0,0x12);
      (symbol_lists->header).substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      break;
    case (uint8_t *)0x1:
      goto switchD_00830d6d_caseD_1;
    case (uint8_t *)0x2:
      goto switchD_00830d6d_caseD_2;
    case (uint8_t *)0x3:
      goto switchD_00830d6d_caseD_3;
    case (uint8_t *)0x4:
      BVar2 = ReadCodeLengthCodeLengths(in_R8);
      if (BVar2 != BROTLI_DECODER_SUCCESS) {
        return BVar2;
      }
      BrotliBuildCodeLengthsHuffmanTable
                ((HuffmanCode *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 code_lengths,in_stack_fffffffffffffdb0);
      memset((uint16_t *)((long)symbol_lists + 0x6fa),0,0x20);
      for (local_228 = 0; local_228 < 0x10; local_228 = local_228 + 1) {
        *(int *)((long)symbol_lists + local_228 * 4 + 0x668) = (int)local_228 + -0x10;
        (symbol_lists->header).symbol_lists[*(int *)((long)symbol_lists + local_228 * 4 + 0x668)] =
             0xffff;
      }
      (symbol_lists->header).symbol = 0;
      (symbol_lists->header).prev_code_len = 8;
      (symbol_lists->header).repeat = 0;
      (symbol_lists->header).repeat_code_len = 0;
      (symbol_lists->header).space = 0x8000;
      (symbol_lists->header).substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
    case (uint8_t *)0x5:
      goto switchD_00830d6d_caseD_5;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
switchD_00830d6d_caseD_5:
  root_bits = (int)((ulong)pBVar4 >> 0x20);
  BVar2 = ReadSymbolCodeLengths(in_RSI,in_RDX);
  if (BVar2 == BROTLI_DECODER_NEEDS_MORE_INPUT) {
    BVar2 = SafeReadSymbolCodeLengths(in_RSI,in_R8);
  }
  if (BVar2 != BROTLI_DECODER_SUCCESS) {
    return BVar2;
  }
  if ((symbol_lists->header).space != 0) {
    return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
  }
  uVar3 = BrotliBuildHuffmanTable
                    ((HuffmanCode *)in_R8,root_bits,(uint16_t *)symbol_lists,
                     (uint16_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  if (in_RCX != (ulong *)0x0) {
    *in_RCX = (ulong)uVar3;
  }
  (symbol_lists->header).substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
  return BROTLI_DECODER_SUCCESS;
switchD_00830d6d_caseD_1:
  while (pBVar4->bit_pos_ < 2) {
    if (pBVar4->next_in == pBVar4->last_in) {
      bVar1 = false;
      goto LAB_0083129a;
    }
    pBVar4->val_ = pBVar4->val_ | (ulong)*pBVar4->next_in << ((byte)pBVar4->bit_pos_ & 0x3f);
    pBVar4->bit_pos_ = pBVar4->bit_pos_ + 8;
    pBVar4->next_in = pBVar4->next_in + 1;
  }
  (symbol_lists->header).symbol = pBVar4->val_ & 3;
  pBVar4->bit_pos_ = pBVar4->bit_pos_ - 2;
  pBVar4->val_ = pBVar4->val_ >> 2;
  bVar1 = true;
LAB_0083129a:
  if (bVar1) {
    (symbol_lists->header).sub_loop_counter = 0;
switchD_00830d6d_caseD_2:
    local_1cc = ReadSimpleHuffmanSymbols(in_RDI,in_RSI,in_R8);
    if (local_1cc == BROTLI_DECODER_SUCCESS) {
switchD_00830d6d_caseD_3:
      if ((symbol_lists->header).symbol == 3) {
        while (pBVar4->bit_pos_ == 0) {
          if (pBVar4->next_in == pBVar4->last_in) {
            bVar1 = false;
            goto LAB_00831565;
          }
          pBVar4->val_ = pBVar4->val_ | (ulong)*pBVar4->next_in << ((byte)pBVar4->bit_pos_ & 0x3f);
          pBVar4->bit_pos_ = pBVar4->bit_pos_ + 8;
          pBVar4->next_in = pBVar4->next_in + 1;
        }
        local_220 = pBVar4->val_ & 1;
        pBVar4->bit_pos_ = pBVar4->bit_pos_ - 1;
        pBVar4->val_ = pBVar4->val_ >> 1;
        bVar1 = true;
LAB_00831565:
        if (!bVar1) {
          (symbol_lists->header).substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        (symbol_lists->header).symbol = local_220 + (symbol_lists->header).symbol;
      }
      uVar3 = BrotliBuildSimpleHuffmanTable
                        ((HuffmanCode *)in_RDX,(int)((ulong)in_RCX >> 0x20),(uint16_t *)in_R8,
                         (uint32_t)((ulong)pBVar4 >> 0x20));
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = (ulong)uVar3;
      }
      (symbol_lists->header).substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      local_1cc = BROTLI_DECODER_SUCCESS;
    }
  }
  else {
    (symbol_lists->header).substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
    local_1cc = BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  return local_1cc;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(brotli_reg_t alphabet_size_max, brotli_reg_t alphabet_size_limit,
                                              HuffmanCode *table, brotli_reg_t *opt_table_size, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliMetablockHeaderArena *h = &s->arena.header;
	/* State machine. */
	for (;;) {
		switch (h->substate_huffman) {
		case BROTLI_STATE_HUFFMAN_NONE:
			if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			BROTLI_LOG_UINT(h->sub_loop_counter);
			/* The value is used as follows:
			   1 for simple code;
			   0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
			if (h->sub_loop_counter != 1) {
				h->space = 32;
				h->repeat = 0; /* num_codes */
				memset(&h->code_length_histo[0], 0,
				       sizeof(h->code_length_histo[0]) * (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
				memset(&h->code_length_code_lengths[0], 0, sizeof(h->code_length_code_lengths));
				h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
				continue;
			}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
			/* Read symbols, codes & code lengths directly. */
			if (!BrotliSafeReadBits(br, 2, &h->symbol)) { /* num_symbols */
				h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			h->sub_loop_counter = 0;
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
			BrotliDecoderErrorCode result = ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
			brotli_reg_t table_size;
			if (h->symbol == 3) {
				brotli_reg_t bits;
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				h->symbol += bits;
			}
			BROTLI_LOG_UINT(h->symbol);
			table_size =
			    BrotliBuildSimpleHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, (uint32_t)h->symbol);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		/* Decode Huffman-coded code lengths. */
		case BROTLI_STATE_HUFFMAN_COMPLEX: {
			brotli_reg_t i;
			BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			BrotliBuildCodeLengthsHuffmanTable(h->table, h->code_length_code_lengths, h->code_length_histo);
			memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
			for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
				h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
				h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
			}

			h->symbol = 0;
			h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
			h->repeat = 0;
			h->repeat_code_len = 0;
			h->space = 32768;
			h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
			brotli_reg_t table_size;
			BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size_limit, s);
			if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
				result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
			}
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}

			if (h->space != 0) {
				BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
			}
			table_size = BrotliBuildHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}